

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

void __thiscall QHttpPartPrivate::checkHeaderCreated(QHttpPartPrivate *this)

{
  qsizetype qVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QLatin1StringView name;
  QHttpHeaders h;
  QNetworkHeadersPrivate *in_stack_ffffffffffffff28;
  QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView> *a;
  QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView> *this_00;
  char *i_00;
  QHttpHeaders *this_01;
  QByteArrayView in_stack_ffffffffffffff50;
  QLatin1StringView local_20;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0x88] & 1U) == 0) {
    local_10 = 0xaaaaaaaaaaaaaaaa;
    i_00 = in_RDI;
    QNetworkHeadersPrivate::headers(in_stack_ffffffffffffff28);
    a = (QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView> *)0x0;
    while( true ) {
      this_01 = (QHttpHeaders *)in_stack_ffffffffffffff50.m_size;
      this_00 = a;
      qVar1 = QHttpHeaders::size((QHttpHeaders *)in_stack_ffffffffffffff28);
      if (qVar1 <= (long)a) break;
      local_20.m_data = (char *)0xaaaaaaaaaaaaaaaa;
      local_20.m_size = -0x5555555555555556;
      local_20 = QHttpHeaders::nameAt(this_01,(qsizetype)i_00);
      in_stack_ffffffffffffff28 = (QNetworkHeadersPrivate *)QLatin1String::data(&local_20);
      QLatin1String::size(&local_20);
      QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)this_00,in_RDI,(qsizetype)a);
      ::operator+((QByteArrayView *)a,(char (*) [3])in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff50 = QHttpHeaders::valueAt((QHttpHeaders *)this_00,(qsizetype)in_RDI);
      ::operator+(&a->a,(QByteArrayView *)in_stack_ffffffffffffff28);
      ::operator+(a,(char (*) [3])in_stack_ffffffffffffff28);
      ::operator+=((QByteArray *)a,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
                    *)in_stack_ffffffffffffff28);
      a = (QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView> *)
          ((long)&(this_00->a).a.m_size + 1);
    }
    QByteArray::operator+=((QByteArray *)a,(char *)in_stack_ffffffffffffff28);
    in_RDI[0x88] = '\x01';
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x2e3b53);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpPartPrivate::checkHeaderCreated() const
{
    if (!headerCreated) {
        // copied from QHttpNetworkRequestPrivate::header() and adapted
        const auto h = headers();
        for (qsizetype i = 0; i < h.size(); ++i) {
            const auto name = h.nameAt(i);
            header += QByteArrayView(name.data(), name.size()) + ": " + h.valueAt(i) + "\r\n";
        }

        header += "\r\n";
        headerCreated = true;
    }
}